

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

ImGuiInputEvent * FindLatestInputEvent(ImGuiInputEventType type,int arg)

{
  int iVar1;
  ImGuiInputEvent *pIVar2;
  uint uVar3;
  long lVar4;
  
  uVar3 = (GImGui->InputEventsQueue).Size;
  do {
    lVar4 = (ulong)uVar3 * 0x18;
    while( true ) {
      if ((int)uVar3 < 1) {
        return (ImGuiInputEvent *)0x0;
      }
      pIVar2 = (GImGui->InputEventsQueue).Data;
      if ((*(ImGuiInputEventType *)((long)&pIVar2[-1].Type + lVar4) == type) &&
         ((iVar1 = *(int *)((long)&pIVar2[-1].field_2 + lVar4), type != ImGuiInputEventType_Key ||
          (iVar1 == arg)))) break;
      uVar3 = uVar3 - 1;
      lVar4 = lVar4 + -0x18;
    }
  } while ((type == ImGuiInputEventType_MouseButton) && (uVar3 = uVar3 - 1, iVar1 != arg));
  return (ImGuiInputEvent *)((long)&pIVar2[-1].Type + lVar4);
}

Assistant:

static ImGuiInputEvent* FindLatestInputEvent(ImGuiInputEventType type, int arg = -1)
{
    ImGuiContext& g = *GImGui;
    for (int n = g.InputEventsQueue.Size - 1; n >= 0; n--)
    {
        ImGuiInputEvent* e = &g.InputEventsQueue[n];
        if (e->Type != type)
            continue;
        if (type == ImGuiInputEventType_Key && e->Key.Key != arg)
            continue;
        if (type == ImGuiInputEventType_MouseButton && e->MouseButton.Button != arg)
            continue;
        return e;
    }
    return NULL;
}